

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O0

bool __thiscall
Clasp::ShortImplicationsGraph::forEach<Clasp::ShortImplicationsGraph::Propagate>
          (ShortImplicationsGraph *this,Literal p,Propagate *op)

{
  bool bVar1;
  uint32 n;
  const_reference this_00;
  const_left_iterator pLVar2;
  pointer ppVar3;
  iterator pLVar4;
  Block *in_RDX;
  uint32 in_ESI;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RDI;
  const_iterator endOf;
  const_iterator imp;
  bool r;
  Block *b;
  const_right_iterator it_1;
  const_left_iterator end;
  const_left_iterator it;
  const_right_iterator rEnd;
  ImplicationList *x;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
  *in_stack_ffffffffffffff58;
  Block *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  uint32 in_stack_ffffffffffffff7c;
  Literal in_stack_ffffffffffffff80;
  Literal in_stack_ffffffffffffff84;
  Literal *local_70;
  bool local_61;
  Block *local_60;
  uint32 in_stack_ffffffffffffffb0;
  Literal in_stack_ffffffffffffffb4;
  Literal in_stack_ffffffffffffffb8;
  Literal in_stack_ffffffffffffffbc;
  Literal in_stack_ffffffffffffffc0;
  const_left_iterator local_30;
  Literal local_8 [2];
  
  local_8[0].rep_ = in_ESI;
  n = Literal::id(local_8);
  this_00 = bk_lib::
            pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
            ::operator[]((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                          *)in_RDI,n);
  bVar1 = ImplicationList::empty((ImplicationList *)in_stack_ffffffffffffff60);
  if (!bVar1) {
    bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
    right_end(in_stack_ffffffffffffff58);
    local_30 = bk_lib::detail::
               left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
               left_begin((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                           *)0x1d7bee);
    pLVar2 = bk_lib::detail::
             left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::left_end
                       ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                         *)this_00);
    for (; local_30 != pLVar2; local_30 = local_30 + 1) {
      in_stack_ffffffffffffffc0.rep_ = local_30->rep_;
      bVar1 = Propagate::unary((Propagate *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      if (!bVar1) {
        return false;
      }
    }
    bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
    right_begin(in_RDI);
    while (bVar1 = std::operator!=((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>
                                    *)in_stack_ffffffffffffff60,
                                   (reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>
                                    *)in_stack_ffffffffffffff58), bVar1) {
      in_stack_ffffffffffffff60 = in_RDX;
      in_stack_ffffffffffffffb4.rep_ = local_8[0].rep_;
      ppVar3 = std::reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>::operator->
                         ((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*> *)
                          in_RDX);
      in_stack_ffffffffffffffb0 = (ppVar3->first).rep_;
      std::reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>::operator->
                ((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*> *)
                 in_stack_ffffffffffffff60);
      bVar1 = Propagate::binary((Propagate *)
                                CONCAT44(in_stack_ffffffffffffffb4.rep_,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                in_stack_ffffffffffffffb8);
      if (!bVar1) {
        return false;
      }
      std::reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*>::operator++
                ((reverse_iterator<const_std::pair<Clasp::Literal,_Clasp::Literal>_*> *)
                 &stack0xffffffffffffffb8);
    }
    local_60 = std::atomic::operator_cast_to_Block_
                         ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x1d7d0b);
    while (local_60 != (Block *)0x0) {
      Literal::flag(local_8);
      local_70 = Block::begin(local_60);
      pLVar4 = Block::end(in_stack_ffffffffffffff60);
      while (local_70 != pLVar4) {
        bVar1 = Literal::flagged(local_70);
        if (bVar1) {
          local_61 = Propagate::unary((Propagate *)
                                      CONCAT44(in_stack_ffffffffffffff7c,local_8[0].rep_),
                                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
          local_70 = local_70 + 1;
        }
        else {
          in_stack_ffffffffffffff80.rep_ = local_70->rep_;
          in_stack_ffffffffffffff7c = local_70[1].rep_;
          in_stack_ffffffffffffff84.rep_ = local_8[0].rep_;
          local_61 = Propagate::binary((Propagate *)
                                       CONCAT44(in_stack_ffffffffffffffb4.rep_,
                                                in_stack_ffffffffffffffb0),in_stack_ffffffffffffffc0
                                       ,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
          local_70 = local_70 + 2;
        }
        if (local_61 == false) {
          return false;
        }
      }
      local_60 = std::atomic::operator_cast_to_Block_
                           ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x1d7e1c);
    }
  }
  return true;
}

Assistant:

bool forEach(Literal p, const OP& op) const {
		const ImplicationList& x = graph_[p.id()];
		if (x.empty()) return true;
		ImplicationList::const_right_iterator rEnd = x.right_end(); // prefetch
		for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
			if (!op.unary(p, *it)) { return false; }
		}
		for (ImplicationList::const_right_iterator it = x.right_begin(); it != rEnd; ++it) {
			if (!op.binary(p, it->first, it->second)) { return false; }
		}
#if CLASP_HAS_THREADS
		for (Block* b = (x).learnt; b ; b = b->next) {
			p.flag(); bool r = true;
			for (Block::const_iterator imp = b->begin(), endOf = b->end(); imp != endOf; ) {
				if (!imp->flagged()) { r = op.binary(p, imp[0], imp[1]); imp += 2; }
				else                 { r = op.unary(p, imp[0]);          imp += 1; }
				if (!r)              { return false; }
			}
		}
#endif
		return true;
	}